

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::COBImporter::BuildNodes(COBImporter *this,Node *root,Scene *scin,aiScene *fill)

{
  float fVar1;
  ai_real aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Type TVar9;
  Shader SVar10;
  Face *pFVar11;
  pointer pVVar12;
  undefined8 uVar13;
  pointer pMVar14;
  element_type *peVar15;
  _Map_pointer pppNVar16;
  Node **ppNVar17;
  undefined1 auVar18 [16];
  ai_real aVar19;
  ai_real aVar20;
  ai_real aVar21;
  ai_real aVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  Material *__ptr;
  long *plVar37;
  _Rb_tree_node_base *p_Var38;
  uint uVar39;
  int iVar40;
  aiNode *paVar41;
  aiMesh *paVar42;
  ulong uVar43;
  aiVector3D *paVar44;
  ulong *puVar45;
  aiFace *paVar46;
  long lVar47;
  uint *puVar48;
  pointer pVVar49;
  Logger *this_00;
  pointer pMVar50;
  aiMaterial *this_01;
  _Rb_tree_node_base *p_Var51;
  aiLight *paVar52;
  aiCamera *paVar53;
  aiNode **__s;
  aiNode *paVar54;
  uint uVar55;
  _Map_pointer pppFVar56;
  aiFace *paVar57;
  _Elt_pointer ppFVar58;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *__range4;
  Node **ppNVar59;
  Light *ndlight;
  Node **ppNVar60;
  _Elt_pointer ppFVar61;
  _Elt_pointer ppFVar62;
  _Map_pointer pppNVar63;
  Material *m;
  ulong uVar64;
  size_t sVar65;
  _Rb_tree_node_base *p_Var66;
  bool bVar67;
  int tmp;
  aiString s;
  Material *local_698;
  aiNode *local_690;
  _Map_pointer local_688;
  _Elt_pointer local_680;
  Scene *local_678;
  shared_ptr<Assimp::COB::Texture> local_670;
  shared_ptr<Assimp::COB::Texture> local_660;
  shared_ptr<Assimp::COB::Texture> local_650;
  _Rb_tree_color local_640;
  _Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> local_638;
  _Rb_tree_node_base *local_5e8;
  _Rb_tree_node_base *local_5e0;
  COBImporter *local_5d8;
  long *local_5d0;
  ulong local_5c8;
  long local_5c0 [2];
  long *local_5b0;
  float local_5a8;
  long local_5a0 [12];
  ios_base local_540 [264];
  aiString local_438;
  
  local_678 = scin;
  local_5d8 = this;
  paVar41 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar41);
  uVar64 = (root->name)._M_string_length;
  if (uVar64 < 0x400) {
    (paVar41->mName).length = (ai_uint32)uVar64;
    memcpy((paVar41->mName).data,(root->name)._M_dataplus._M_p,uVar64);
    (paVar41->mName).data[uVar64] = '\0';
  }
  fVar33 = (root->transform).a1;
  fVar34 = (root->transform).a2;
  fVar35 = (root->transform).a3;
  fVar36 = (root->transform).a4;
  fVar29 = (root->transform).b1;
  fVar30 = (root->transform).b2;
  fVar31 = (root->transform).b3;
  fVar32 = (root->transform).b4;
  fVar25 = (root->transform).c1;
  fVar26 = (root->transform).c2;
  fVar27 = (root->transform).c3;
  fVar28 = (root->transform).c4;
  fVar1 = (root->transform).d2;
  fVar23 = (root->transform).d3;
  fVar24 = (root->transform).d4;
  (paVar41->mTransformation).d1 = (root->transform).d1;
  (paVar41->mTransformation).d2 = fVar1;
  (paVar41->mTransformation).d3 = fVar23;
  (paVar41->mTransformation).d4 = fVar24;
  (paVar41->mTransformation).c1 = fVar25;
  (paVar41->mTransformation).c2 = fVar26;
  (paVar41->mTransformation).c3 = fVar27;
  (paVar41->mTransformation).c4 = fVar28;
  (paVar41->mTransformation).b1 = fVar29;
  (paVar41->mTransformation).b2 = fVar30;
  (paVar41->mTransformation).b3 = fVar31;
  (paVar41->mTransformation).b4 = fVar32;
  (paVar41->mTransformation).a1 = fVar33;
  (paVar41->mTransformation).a2 = fVar34;
  (paVar41->mTransformation).a3 = fVar35;
  (paVar41->mTransformation).a4 = fVar36;
  TVar9 = root->type;
  local_690 = paVar41;
  if (TVar9 == TYPE_CAMERA) {
    paVar53 = (aiCamera *)operator_new(0x438);
    (paVar53->mName).length = 0;
    (paVar53->mName).data[0] = '\0';
    memset((paVar53->mName).data + 1,0x1b,0x3ff);
    (paVar53->mPosition).x = 0.0;
    (paVar53->mPosition).y = 0.0;
    *(undefined8 *)&(paVar53->mPosition).z = 0;
    (paVar53->mUp).y = 1.0;
    (paVar53->mUp).z = 0.0;
    (paVar53->mLookAt).x = 0.0;
    (paVar53->mLookAt).y = 0.0;
    *(undefined8 *)&(paVar53->mLookAt).z = 0x3f490fdb3f800000;
    paVar53->mClipPlaneNear = 0.1;
    paVar53->mClipPlaneFar = 1000.0;
    paVar53->mAspect = 0.0;
    uVar39 = fill->mNumCameras;
    fill->mNumCameras = uVar39 + 1;
    fill->mCameras[uVar39] = paVar53;
    uVar64 = (root->name)._M_string_length;
    if (uVar64 < 0x400) {
      (paVar53->mName).length = (ai_uint32)uVar64;
      memcpy((paVar53->mName).data,(root->name)._M_dataplus._M_p,uVar64);
      (paVar53->mName).data[uVar64] = '\0';
    }
  }
  else if (TVar9 == TYPE_LIGHT) {
    paVar52 = (aiLight *)operator_new(0x46c);
    (paVar52->mName).length = 0;
    (paVar52->mName).data[0] = '\0';
    memset((paVar52->mName).data + 1,0x1b,0x3ff);
    paVar52->mType = aiLightSource_UNDEFINED;
    (paVar52->mPosition).x = 0.0;
    (paVar52->mPosition).y = 0.0;
    (paVar52->mPosition).z = 0.0;
    (paVar52->mDirection).x = 0.0;
    (paVar52->mDirection).y = 0.0;
    *(undefined8 *)&(paVar52->mDirection).z = 0;
    (paVar52->mUp).x = 0.0;
    (paVar52->mUp).y = 0.0;
    *(undefined8 *)&(paVar52->mUp).z = 0;
    paVar52->mAttenuationLinear = 1.0;
    paVar52->mAttenuationQuadratic = 0.0;
    (paVar52->mColorDiffuse).r = 0.0;
    (paVar52->mColorDiffuse).g = 0.0;
    (paVar52->mColorDiffuse).b = 0.0;
    (paVar52->mColorSpecular).r = 0.0;
    (paVar52->mColorSpecular).g = 0.0;
    *(undefined8 *)&(paVar52->mColorSpecular).b = 0;
    (paVar52->mColorAmbient).g = 0.0;
    (paVar52->mColorAmbient).b = 0.0;
    paVar52->mAngleInnerCone = 6.2831855;
    paVar52->mAngleOuterCone = 6.2831855;
    (paVar52->mSize).x = 0.0;
    (paVar52->mSize).y = 0.0;
    uVar39 = fill->mNumLights;
    fill->mNumLights = uVar39 + 1;
    fill->mLights[uVar39] = paVar52;
    uVar64 = (root->name)._M_string_length;
    if (uVar64 < 0x400) {
      (paVar52->mName).length = (ai_uint32)uVar64;
      memcpy((paVar52->mName).data,(root->name)._M_dataplus._M_p,uVar64);
      (paVar52->mName).data[uVar64] = '\0';
    }
    aVar21 = *(ai_real *)&root[1]._vptr_Node;
    aVar22 = *(ai_real *)((long)&root[1]._vptr_Node + 4);
    aVar2 = *(ai_real *)&root->field_0xd4;
    aVar19 = *(ai_real *)&root->field_0xd4;
    aVar20 = *(ai_real *)&root[1]._vptr_Node;
    (paVar52->mColorSpecular).g = aVar21;
    (paVar52->mColorSpecular).b = aVar22;
    (paVar52->mColorAmbient).r = aVar2;
    (paVar52->mColorAmbient).g = aVar21;
    (paVar52->mColorAmbient).b = aVar22;
    (paVar52->mColorDiffuse).r = aVar19;
    (paVar52->mColorDiffuse).g = aVar20;
    (paVar52->mColorDiffuse).b = aVar22;
    (paVar52->mColorSpecular).r = aVar2;
    uVar5 = root[1].super_ChunkInfo.id;
    uVar8 = root[1].super_ChunkInfo.parent_id;
    paVar52->mAngleInnerCone = (float)uVar8 * 0.017453292;
    paVar52->mAngleOuterCone = (float)uVar5 * 0.017453292;
    paVar52->mType = (uint)(root[1].super_ChunkInfo.version == 0) * 2 + aiLightSource_DIRECTIONAL;
  }
  else if (((TVar9 == TYPE_MESH) &&
           (root[1].temp_children.
            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_map != *(_Map_pointer *)&root[1].type)) &&
          (*(_func_int ***)&root[1].super_ChunkInfo != root[1]._vptr_Node)) {
    p_Var51 = (_Rb_tree_node_base *)
              root[1].temp_children.
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    p_Var66 = (_Rb_tree_node_base *)
              &root[1].temp_children.
               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
    p_Var38 = p_Var66;
    if (p_Var51 != p_Var66) {
      do {
        local_5e8 = p_Var38;
        local_640 = p_Var51[1]._M_color;
        std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::deque
                  ((deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)&local_638,
                   (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)
                   &p_Var51[1]._M_parent);
        if (local_638._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_638._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          uVar64 = 0;
          pppFVar56 = local_638._M_impl.super__Deque_impl_data._M_start._M_node;
          ppFVar58 = local_638._M_impl.super__Deque_impl_data._M_start._M_last;
          ppFVar61 = local_638._M_impl.super__Deque_impl_data._M_start._M_cur;
          do {
            ppFVar62 = ppFVar61 + 1;
            if (ppFVar62 == ppFVar58) {
              ppFVar62 = pppFVar56[1];
              pppFVar56 = pppFVar56 + 1;
              ppFVar58 = ppFVar62 + 0x40;
            }
            uVar64 = uVar64 + ((long)((*ppFVar61)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)((*ppFVar61)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
            ppFVar61 = ppFVar62;
          } while (ppFVar62 != local_638._M_impl.super__Deque_impl_data._M_finish._M_cur);
          if (uVar64 != 0) {
            local_5e0 = p_Var51;
            paVar42 = (aiMesh *)operator_new(0x520);
            paVar42->mPrimitiveTypes = 0;
            paVar42->mNumVertices = 0;
            paVar42->mNumFaces = 0;
            memset(&paVar42->mVertices,0,0xcc);
            paVar42->mBones = (aiBone **)0x0;
            paVar42->mMaterialIndex = 0;
            (paVar42->mName).length = 0;
            (paVar42->mName).data[0] = '\0';
            memset((paVar42->mName).data + 1,0x1b,0x3ff);
            paVar42->mNumAnimMeshes = 0;
            paVar42->mAnimMeshes = (aiAnimMesh **)0x0;
            paVar42->mMethod = 0;
            (paVar42->mAABB).mMin.x = 0.0;
            (paVar42->mAABB).mMin.y = 0.0;
            (paVar42->mAABB).mMin.z = 0.0;
            (paVar42->mAABB).mMax.x = 0.0;
            (paVar42->mAABB).mMax.y = 0.0;
            (paVar42->mAABB).mMax.z = 0.0;
            memset(paVar42->mColors,0,0xa0);
            uVar39 = fill->mNumMeshes;
            fill->mNumMeshes = uVar39 + 1;
            fill->mMeshes[uVar39] = paVar42;
            local_690->mNumMeshes = local_690->mNumMeshes + 1;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = uVar64;
            uVar43 = SUB168(auVar18 * ZEXT816(0xc),0);
            uVar64 = uVar43;
            if (SUB168(auVar18 * ZEXT816(0xc),8) != 0) {
              uVar64 = 0xffffffffffffffff;
            }
            paVar44 = (aiVector3D *)operator_new__(uVar64);
            sVar65 = ((uVar43 - 0xc) / 0xc) * 0xc + 0xc;
            memset(paVar44,0,sVar65);
            paVar42->mVertices = paVar44;
            paVar44 = (aiVector3D *)operator_new__(uVar64);
            memset(paVar44,0,sVar65);
            ppFVar58 = local_638._M_impl.super__Deque_impl_data._M_start._M_last;
            ppFVar61 = local_638._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_688 = local_638._M_impl.super__Deque_impl_data._M_start._M_node;
            paVar42->mTextureCoords[0] = paVar44;
            local_680 = local_638._M_impl.super__Deque_impl_data._M_finish._M_cur;
            uVar64 = ((long)local_638._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_638._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                     ((long)local_638._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_638._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                     ((((ulong)((long)local_638._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_638._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) +
                     (ulong)(local_638._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x40;
            puVar45 = (ulong *)operator_new__(-(ulong)(uVar64 >> 0x3c != 0) | uVar64 * 0x10 | 8);
            *puVar45 = uVar64;
            paVar46 = (aiFace *)(puVar45 + 1);
            if (uVar64 != 0) {
              paVar57 = paVar46;
              do {
                paVar57->mNumIndices = 0;
                paVar57->mIndices = (uint *)0x0;
                paVar57 = paVar57 + 1;
              } while (paVar57 != paVar46 + uVar64);
            }
            paVar42->mFaces = paVar46;
            if (ppFVar61 != local_680) {
              do {
                pFVar11 = *ppFVar61;
                if ((pFVar11->indices).
                    super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (pFVar11->indices).
                    super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  uVar39 = paVar42->mNumFaces;
                  paVar42->mNumFaces = uVar39 + 1;
                  paVar46 = paVar42->mFaces + uVar39;
                  lVar47 = (long)(pFVar11->indices).
                                 super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pFVar11->indices).
                                 super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  uVar64 = lVar47 >> 1;
                  if (lVar47 < 0) {
                    uVar64 = 0xffffffffffffffff;
                  }
                  puVar48 = (uint *)operator_new__(uVar64);
                  paVar46->mIndices = puVar48;
                  pVVar12 = (pFVar11->indices).
                            super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  for (pVVar49 = (pFVar11->indices).
                                 super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pVVar49 != pVVar12;
                      pVVar49 = pVVar49 + 1) {
                    uVar64 = (ulong)pVVar49->pos_idx;
                    lVar47 = *(long *)&root[1].type;
                    uVar43 = ((long)root[1].temp_children.
                                    super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                    ._M_impl.super__Deque_impl_data._M_map - lVar47 >> 2) *
                             -0x5555555555555555;
                    if (uVar43 < uVar64 || uVar43 - uVar64 == 0) {
                      local_438._0_8_ = local_438.data + 0xc;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_438,"Position index out of range","");
                      ThrowException((string *)&local_438);
                    }
                    if ((ulong)(*(long *)&root[1].super_ChunkInfo - (long)root[1]._vptr_Node >> 3)
                        <= (ulong)pVVar49->uv_idx) {
                      local_438._0_8_ = local_438.data + 0xc;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_438,"UV index out of range","");
                      ThrowException((string *)&local_438);
                    }
                    paVar44 = paVar42->mVertices;
                    uVar39 = paVar42->mNumVertices;
                    paVar44[uVar39].z = *(float *)(lVar47 + 8 + uVar64 * 0xc);
                    uVar13 = *(undefined8 *)(lVar47 + uVar64 * 0xc);
                    paVar44 = paVar44 + uVar39;
                    paVar44->x = (float)(int)uVar13;
                    paVar44->y = (float)(int)((ulong)uVar13 >> 0x20);
                    paVar44 = paVar42->mTextureCoords[0];
                    uVar39 = paVar42->mNumVertices;
                    *(_func_int **)(paVar44 + uVar39) = root[1]._vptr_Node[pVVar49->uv_idx];
                    paVar44[uVar39].z = 0.0;
                    uVar39 = paVar42->mNumVertices;
                    paVar42->mNumVertices = uVar39 + 1;
                    uVar55 = paVar46->mNumIndices;
                    paVar46->mNumIndices = uVar55 + 1;
                    paVar46->mIndices[uVar55] = uVar39;
                  }
                }
                ppFVar61 = ppFVar61 + 1;
                if (ppFVar61 == ppFVar58) {
                  ppFVar61 = local_688[1];
                  local_688 = local_688 + 1;
                  ppFVar58 = ppFVar61 + 0x40;
                }
              } while (ppFVar61 != local_680);
            }
            paVar42->mMaterialIndex = fill->mNumMaterials;
            pMVar50 = (local_678->materials).
                      super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pMVar14 = (local_678->materials).
                      super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pMVar50 != pMVar14) {
              do {
                if (((pMVar50->super_ChunkInfo).parent_id == (root->super_ChunkInfo).id) &&
                   (pMVar50->matnum == local_640)) {
                  local_698 = (pointer)0x0;
                  goto LAB_004c2d77;
                }
                pMVar50 = pMVar50 + 1;
              } while (pMVar50 != pMVar14);
            }
            local_698 = (Material *)0x0;
            this_00 = DefaultLogger::get();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438,"Could not resolve material index ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438," - creating default material for this slot",0x2a);
            std::__cxx11::stringbuf::str();
            Logger::debug(this_00,(char *)local_5b0);
            if (local_5b0 != local_5a0) {
              operator_delete(local_5b0,local_5a0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
            std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
            pMVar50 = (pointer)operator_new(0x90);
            __ptr = local_698;
            (pMVar50->super_ChunkInfo).id = 0;
            (pMVar50->super_ChunkInfo).parent_id = 0;
            (pMVar50->super_ChunkInfo).version = 0;
            (pMVar50->super_ChunkInfo).size = 0xffffffff;
            (pMVar50->type)._M_dataplus._M_p = (pointer)&(pMVar50->type).field_2;
            (pMVar50->type)._M_string_length = 0;
            (pMVar50->type).field_2._M_local_buf[0] = '\0';
            (pMVar50->rgb).r = 0.0;
            (pMVar50->rgb).g = 0.0;
            *(undefined8 *)&(pMVar50->rgb).b = 0;
            pMVar50->alpha = 0.0;
            pMVar50->exp = 0.0;
            pMVar50->ior = 0.0;
            pMVar50->ka = 0.0;
            pMVar50->ks = 1.0;
            pMVar50->matnum = 0xffffffff;
            pMVar50->shader = FLAT;
            pMVar50->autofacet = FACETED;
            *(undefined8 *)&pMVar50->autofacet_angle = 0;
            *(undefined8 *)
             ((long)&(pMVar50->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar50->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            *(undefined8 *)
             ((long)&(pMVar50->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar50->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            (pMVar50->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pMVar50->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar67 = local_698 != (Material *)0x0;
            local_698 = pMVar50;
            if (bVar67) {
              std::default_delete<const_Assimp::COB::Material>::operator()
                        ((default_delete<const_Assimp::COB::Material> *)&local_698,__ptr);
            }
LAB_004c2d77:
            this_01 = (aiMaterial *)operator_new(0x10);
            aiMaterial::aiMaterial(this_01);
            uVar39 = fill->mNumMaterials;
            fill->mNumMaterials = uVar39 + 1;
            fill->mMaterials[uVar39] = this_01;
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[6]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_5b0,(char (*) [6])"#mat_");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b0,"_",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
            std::__cxx11::stringbuf::str();
            plVar37 = local_5d0;
            sVar65 = local_5c8 & 0xffffffff;
            if ((local_5c8 & 0xfffffc00) != 0) {
              sVar65 = 0x3ff;
            }
            local_438.length = (ai_uint32)sVar65;
            memcpy((void *)((long)&local_438 + 4),local_5d0,sVar65);
            *(undefined1 *)((long)&local_438 + sVar65 + 4) = 0;
            if (plVar37 != local_5c0) {
              operator_delete(plVar37,local_5c0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b0);
            std::ios_base::~ios_base(local_540);
            aiMaterial::AddProperty(this_01,&local_438,"?mat.name",0,0);
            p_Var51 = local_5e0;
            p_Var66 = local_5e8;
            uVar39 = *(uint *)&root[1].temp_children.
                               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node & 4;
            uVar55 = uVar39 >> 2;
            local_5b0._0_4_ = uVar55;
            if (uVar39 != 0) {
              aiMaterial::AddBinaryProperty(this_01,&local_5b0,4,"$mat.wireframe",0,0,aiPTI_Integer)
              ;
            }
            SVar10 = pMVar50->shader;
            if (SVar10 == METAL) {
              local_5b0 = (long *)CONCAT44(local_5b0._4_4_,8);
            }
            else if (SVar10 == PHONG) {
              local_5b0 = (long *)CONCAT44(local_5b0._4_4_,3);
            }
            else {
              if (SVar10 != FLAT) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/COB/COBLoader.cpp"
                              ,0x152,
                              "aiNode *Assimp::COBImporter::BuildNodes(const Node &, const Scene &, aiScene *)"
                             );
              }
              local_5b0 = (long *)CONCAT44(local_5b0._4_4_,2);
            }
            aiMaterial::AddBinaryProperty(this_01,&local_5b0,4,"$mat.shadingm",0,0,aiPTI_Integer);
            if ((uint)local_5b0 != 2) {
              aiMaterial::AddBinaryProperty
                        (this_01,&pMVar50->exp,4,"$mat.shininess",0,0,aiPTI_Float);
            }
            aiMaterial::AddBinaryProperty(this_01,&pMVar50->ior,4,"$mat.refracti",0,0,aiPTI_Float);
            aiMaterial::AddBinaryProperty(this_01,&pMVar50->rgb,0xc,"$clr.diffuse",0,0,aiPTI_Float);
            fVar1 = pMVar50->ks;
            local_5a8 = (pMVar50->rgb).b * fVar1;
            uVar3 = (pMVar50->rgb).r;
            uVar6 = (pMVar50->rgb).g;
            local_5b0 = (long *)CONCAT44(fVar1 * (float)uVar6,fVar1 * (float)uVar3);
            aiMaterial::AddBinaryProperty(this_01,&local_5b0,0xc,"$clr.specular",0,0,aiPTI_Float);
            fVar1 = pMVar50->ka;
            local_5a8 = (pMVar50->rgb).b * fVar1;
            uVar4 = (pMVar50->rgb).r;
            uVar7 = (pMVar50->rgb).g;
            local_5b0 = (long *)CONCAT44(fVar1 * (float)uVar7,fVar1 * (float)uVar4);
            aiMaterial::AddBinaryProperty(this_01,&local_5b0,0xc,"$clr.ambient",0,0,aiPTI_Float);
            peVar15 = (pMVar50->tex_color).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar15 != (element_type *)0x0) {
              local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pMVar50->tex_color).
                   super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_650.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_650.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peVar15;
              ConvertTexture(&local_650,this_01,aiTextureType_DIFFUSE);
              if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_650.
                           super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            peVar15 = (pMVar50->tex_env).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar15 != (element_type *)0x0) {
              local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pMVar50->tex_env).
                   super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_660.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_660.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peVar15;
              ConvertTexture(&local_660,this_01,aiTextureType_UNKNOWN);
              if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_660.
                           super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            peVar15 = (pMVar50->tex_bump).
                      super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar15 != (element_type *)0x0) {
              local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (pMVar50->tex_bump).
                   super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_670.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_670.
                        super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peVar15;
              ConvertTexture(&local_670,this_01,aiTextureType_HEIGHT);
              if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_670.
                           super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            if (local_698 != (Material *)0x0) {
              std::default_delete<const_Assimp::COB::Material>::operator()
                        ((default_delete<const_Assimp::COB::Material> *)&local_698,local_698);
            }
          }
        }
        std::_Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::~_Deque_base
                  (&local_638);
        p_Var51 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var51);
        p_Var38 = local_5e8;
      } while (p_Var51 != p_Var66);
    }
  }
  paVar41 = local_690;
  if ((ulong)local_690->mNumMeshes != 0) {
    puVar48 = (uint *)operator_new__((ulong)local_690->mNumMeshes << 2);
    paVar41->mMeshes = puVar48;
    iVar40 = -1;
    uVar64 = 0;
    do {
      paVar41->mMeshes[uVar64] = fill->mNumMeshes + iVar40;
      uVar64 = uVar64 + 1;
      iVar40 = iVar40 + -1;
    } while (uVar64 < paVar41->mNumMeshes);
  }
  pppNVar16 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppNVar63 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppNVar17 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppNVar59 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppNVar60 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar64 = ((long)ppNVar60 - (long)ppNVar59 >> 3) +
           ((long)ppNVar17 -
            (long)(root->temp_children).
                  super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)pppNVar16 - (long)pppNVar63) >> 3) - 1) +
           (ulong)(pppNVar16 == (_Map_pointer)0x0)) * 0x40;
  uVar64 = -(ulong)(uVar64 >> 0x3d != 0) | uVar64 * 8;
  __s = (aiNode **)operator_new__(uVar64);
  memset(__s,0,uVar64);
  paVar41 = local_690;
  local_690->mChildren = __s;
  while (ppNVar59 != ppNVar17) {
    paVar54 = BuildNodes(local_5d8,*ppNVar59,local_678,fill);
    uVar39 = paVar41->mNumChildren;
    paVar41->mNumChildren = uVar39 + 1;
    paVar41->mChildren[uVar39] = paVar54;
    paVar54->mParent = paVar41;
    ppNVar59 = ppNVar59 + 1;
    if (ppNVar59 == ppNVar60) {
      ppNVar59 = pppNVar63[1];
      pppNVar63 = pppNVar63 + 1;
      ppNVar60 = ppNVar59 + 0x40;
    }
  }
  return paVar41;
}

Assistant:

aiNode* COBImporter::BuildNodes(const Node& root,const Scene& scin,aiScene* fill)
{
    aiNode* nd = new aiNode();
    nd->mName.Set(root.name);
    nd->mTransformation = root.transform;

    // Note to everybody believing Voodoo is appropriate here:
    // I know polymorphism, run as fast as you can ;-)
    if (Node::TYPE_MESH == root.type) {
        const Mesh& ndmesh = (const Mesh&)(root);
        if (ndmesh.vertex_positions.size() && ndmesh.texture_coords.size()) {

            typedef std::pair<unsigned int,Mesh::FaceRefList> Entry;
            for(const Entry& reflist : ndmesh.temp_map) {
                {   // create mesh
                    size_t n = 0;
                    for(Face* f : reflist.second) {
                        n += f->indices.size();
                    }
                    if (!n) {
                        continue;
                    }
                    aiMesh* outmesh = fill->mMeshes[fill->mNumMeshes++] = new aiMesh();
                    ++nd->mNumMeshes;

                    outmesh->mVertices = new aiVector3D[n];
                    outmesh->mTextureCoords[0] = new aiVector3D[n];

                    outmesh->mFaces = new aiFace[reflist.second.size()]();
                    for(Face* f : reflist.second) {
                        if (f->indices.empty()) {
                            continue;
                        }

                        aiFace& fout = outmesh->mFaces[outmesh->mNumFaces++];
                        fout.mIndices = new unsigned int[f->indices.size()];

                        for(VertexIndex& v : f->indices) {
                            if (v.pos_idx >= ndmesh.vertex_positions.size()) {
                                ThrowException("Position index out of range");
                            }
                            if (v.uv_idx >= ndmesh.texture_coords.size()) {
                                ThrowException("UV index out of range");
                            }
                            outmesh->mVertices[outmesh->mNumVertices] = ndmesh.vertex_positions[ v.pos_idx ];
                            outmesh->mTextureCoords[0][outmesh->mNumVertices] = aiVector3D(
                                ndmesh.texture_coords[ v.uv_idx ].x,
                                ndmesh.texture_coords[ v.uv_idx ].y,
                                0.f
                            );

                            fout.mIndices[fout.mNumIndices++] = outmesh->mNumVertices++;
                        }
                    }
                    outmesh->mMaterialIndex = fill->mNumMaterials;
                }{  // create material
                    const Material* min = NULL;
                    for(const Material& m : scin.materials) {
                        if (m.parent_id == ndmesh.id && m.matnum == reflist.first) {
                            min = &m;
                            break;
                        }
                    }
                    std::unique_ptr<const Material> defmat;
                    if(!min) {
                        ASSIMP_LOG_DEBUG(format()<<"Could not resolve material index "
                            <<reflist.first<<" - creating default material for this slot");

                        defmat.reset(min=new Material());
                    }

                    aiMaterial* mat = new aiMaterial();
                    fill->mMaterials[fill->mNumMaterials++] = mat;

                    const aiString s(format("#mat_")<<fill->mNumMeshes<<"_"<<min->matnum);
                    mat->AddProperty(&s,AI_MATKEY_NAME);

                    if(int tmp = ndmesh.draw_flags & Mesh::WIRED ? 1 : 0) {
                        mat->AddProperty(&tmp,1,AI_MATKEY_ENABLE_WIREFRAME);
                    }

                    {   int shader;
                        switch(min->shader)
                        {
                        case Material::FLAT:
                            shader = aiShadingMode_Gouraud;
                            break;

                        case Material::PHONG:
                            shader = aiShadingMode_Phong;
                            break;

                        case Material::METAL:
                            shader = aiShadingMode_CookTorrance;
                            break;

                        default:
                            ai_assert(false); // shouldn't be here
                        }
                        mat->AddProperty(&shader,1,AI_MATKEY_SHADING_MODEL);
                        if(shader != aiShadingMode_Gouraud) {
                            mat->AddProperty(&min->exp,1,AI_MATKEY_SHININESS);
                        }
                    }

                    mat->AddProperty(&min->ior,1,AI_MATKEY_REFRACTI);
                    mat->AddProperty(&min->rgb,1,AI_MATKEY_COLOR_DIFFUSE);

                    aiColor3D c = aiColor3D(min->rgb)*min->ks;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);

                    c = aiColor3D(min->rgb)*min->ka;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);

                    // convert textures if some exist.
                    if(min->tex_color) {
                        ConvertTexture(min->tex_color,mat,aiTextureType_DIFFUSE);
                    }
                    if(min->tex_env) {
                        ConvertTexture(min->tex_env  ,mat,aiTextureType_UNKNOWN);
                    }
                    if(min->tex_bump) {
                        ConvertTexture(min->tex_bump ,mat,aiTextureType_HEIGHT);
                    }
                }
            }
        }
    }
    else if (Node::TYPE_LIGHT == root.type) {
        const Light& ndlight = (const Light&)(root);
        aiLight* outlight = fill->mLights[fill->mNumLights++] = new aiLight();

        outlight->mName.Set(ndlight.name);
        outlight->mColorDiffuse = outlight->mColorAmbient = outlight->mColorSpecular = ndlight.color;

        outlight->mAngleOuterCone = AI_DEG_TO_RAD(ndlight.angle);
        outlight->mAngleInnerCone = AI_DEG_TO_RAD(ndlight.inner_angle);

        // XXX
        outlight->mType = ndlight.ltype==Light::SPOT ? aiLightSource_SPOT : aiLightSource_DIRECTIONAL;
    }
    else if (Node::TYPE_CAMERA == root.type) {
        const Camera& ndcam = (const Camera&)(root);
        aiCamera* outcam = fill->mCameras[fill->mNumCameras++] = new aiCamera();

        outcam->mName.Set(ndcam.name);
    }

    // add meshes
    if (nd->mNumMeshes) { // mMeshes must be NULL if count is 0
        nd->mMeshes = new unsigned int[nd->mNumMeshes];
        for(unsigned int i = 0; i < nd->mNumMeshes;++i) {
            nd->mMeshes[i] = fill->mNumMeshes-i-1;
        }
    }

    // add children recursively
    nd->mChildren = new aiNode*[root.temp_children.size()]();
    for(const Node* n : root.temp_children) {
        (nd->mChildren[nd->mNumChildren++] = BuildNodes(*n,scin,fill))->mParent = nd;
    }

    return nd;
}